

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_local_file_header(archive_read *a,archive_entry *entry,zip *zip)

{
  int64_t *piVar1;
  byte bVar2;
  uint32_t uVar3;
  zip_entry *zip_entry;
  long lVar4;
  size_t min;
  uint16_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  unsigned_long uVar8;
  archive_string_conv *paVar9;
  int *piVar10;
  time_t tVar11;
  ulong min_00;
  wchar_t *__s;
  size_t sVar12;
  int64_t iVar13;
  long lVar14;
  ushort uVar15;
  uint uVar16;
  char cVar17;
  char *pcVar18;
  int iVar19;
  ulong min_01;
  
  zip_entry = zip->entry;
  lVar14 = zip_entry->compressed_size;
  lVar4 = zip_entry->uncompressed_size;
  uVar3 = zip_entry->cm_zlib_crc32;
  zip->decompress_init = '\0';
  zip->end_of_entry = '\0';
  zip->entry_compressed_bytes_read = 0;
  zip->entry_uncompressed_bytes_read = 0;
  uVar8 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->entry_crc32 = uVar8;
  if ((zip->sconv == (archive_string_conv *)0x0) && (zip->init_default_conversion == 0)) {
    paVar9 = archive_string_default_conversion_for_read(&a->archive);
    zip->sconv_default = paVar9;
    zip->init_default_conversion = 1;
  }
  piVar10 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar10 == (int *)0x0) {
LAB_0045fd71:
    pcVar18 = "Truncated ZIP file header";
    iVar19 = 0x54;
  }
  else {
    if (*piVar10 == 0x4034b50) {
      iVar19 = piVar10[1];
      zip_entry->system = *(uchar *)((long)piVar10 + 5);
      bVar2 = *(byte *)((long)piVar10 + 6);
      zip_entry->zip_flags = *(uint16_t *)((long)piVar10 + 6);
      if ((bVar2 & 0x41) != 0) {
        zip->has_encrypted_entries = 1;
        archive_entry_set_is_data_encrypted(entry,'\x01');
        if ((~zip_entry->zip_flags & 0x2041) == 0) {
          archive_entry_set_is_metadata_encrypted(entry,'\x01');
          return L'\xffffffe2';
        }
      }
      zip_entry->compression = (uchar)piVar10[2];
      tVar11 = zip_time((char *)((long)piVar10 + 10));
      zip_entry->mtime = tVar11;
      zip_entry->cm_zlib_crc32 = *(uint32_t *)((long)piVar10 + 0xe);
      zip_entry->compressed_size = (ulong)*(uint *)((long)piVar10 + 0x12);
      zip_entry->uncompressed_size = (ulong)*(uint *)((long)piVar10 + 0x16);
      min_01 = (ulong)*(ushort *)((long)piVar10 + 0x1a);
      min_00 = (ulong)*(ushort *)(piVar10 + 7);
      __archive_read_consume(a,0x1e);
      pcVar18 = (char *)__archive_read_ahead(a,min_01,(ssize_t *)0x0);
      if (pcVar18 == (char *)0x0) goto LAB_0045fd71;
      if ((zip_entry->zip_flags & 0x800) == 0) {
        paVar9 = zip->sconv;
        if (paVar9 == (archive_string_conv *)0x0) {
          paVar9 = zip->sconv_default;
        }
      }
      else {
        paVar9 = zip->sconv_utf8;
        if (paVar9 == (archive_string_conv *)0x0) {
          paVar9 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
          zip->sconv_utf8 = paVar9;
          if (paVar9 == (archive_string_conv *)0x0) {
            return L'\xffffffe2';
          }
        }
      }
      wVar6 = _archive_entry_copy_pathname_l(entry,pcVar18,min_01,paVar9);
      if (wVar6 != L'\0') {
        piVar10 = __errno_location();
        if (*piVar10 != 0xc) {
          pcVar18 = archive_string_conversion_charset_name(paVar9);
          archive_set_error(&a->archive,0x54,
                            "Pathname cannot be converted from %s to current locale.",pcVar18);
          wVar6 = L'\xffffffec';
          goto LAB_0045fc5a;
        }
        pcVar18 = "Can\'t allocate memory for Pathname";
LAB_0045fc23:
        iVar19 = 0xc;
        goto LAB_0045fd80;
      }
      wVar6 = L'\0';
LAB_0045fc5a:
      __archive_read_consume(a,min_01);
      uVar15 = zip_entry->mode;
      if ((uVar15 & 0xf000) == 0x1000) {
        uVar5 = uVar15 & 0xfff | 0x8000;
LAB_0045fc89:
        zip_entry->mode = uVar5;
      }
      else if (uVar15 < 0x1000) {
        __s = archive_entry_pathname_w(entry);
        if (__s == (wchar_t *)0x0) {
          pcVar18 = archive_entry_pathname(entry);
          if (((pcVar18 == (char *)0x0) || (sVar12 = strlen(pcVar18), sVar12 == 0)) ||
             (uVar15 = 0x4000, pcVar18[sVar12 - 1] != '/')) goto LAB_0045fcfa;
        }
        else {
          sVar12 = wcslen(__s);
          if ((sVar12 == 0) || (uVar15 = 0x4000, __s[sVar12 - 1] != L'/')) {
LAB_0045fcfa:
            uVar15 = 0x8000;
          }
        }
        uVar15 = uVar15 | zip_entry->mode;
        zip_entry->mode = uVar15;
        if (uVar15 == 0x4000) {
          uVar5 = 0x41fd;
        }
        else {
          if (uVar15 != 0x8000) goto LAB_0045fd2b;
          uVar5 = 0x81b4;
        }
        goto LAB_0045fc89;
      }
LAB_0045fd2b:
      pcVar18 = (char *)__archive_read_ahead(a,min_00,(ssize_t *)0x0);
      if (pcVar18 == (char *)0x0) goto LAB_0045fd71;
      piVar1 = &zip_entry->compressed_size;
      process_extra(pcVar18,min_00,zip_entry);
      __archive_read_consume(a,min_00);
      if ((zip_entry->flags & 2) != 0) {
        *(byte *)&zip_entry->zip_flags = (byte)zip_entry->zip_flags & 0xf7;
        if (zip_entry->cm_zlib_crc32 == 0) {
          zip_entry->cm_zlib_crc32 = uVar3;
        }
        else if (zip_entry->cm_zlib_crc32 != uVar3 && zip->ignore_crc32 == '\0') {
          archive_set_error(&a->archive,0x54,"Inconsistent CRC32 values");
          wVar6 = L'\xffffffec';
        }
        if (*piVar1 == 0) {
          *piVar1 = lVar14;
        }
        else if (*piVar1 != lVar14) {
          archive_set_error(&a->archive,0x54,
                            "Inconsistent compressed size: %jd in central directory, %jd in local header"
                           );
          wVar6 = L'\xffffffec';
        }
        if (zip_entry->uncompressed_size == 0) {
          zip_entry->uncompressed_size = lVar4;
        }
        else if (zip_entry->uncompressed_size != lVar4) {
          archive_set_error(&a->archive,0x54,
                            "Inconsistent uncompressed size: %jd in central directory, %jd in local header"
                           );
          wVar6 = L'\xffffffec';
        }
      }
      archive_entry_set_mode(entry,(uint)zip_entry->mode);
      archive_entry_set_uid(entry,zip_entry->uid);
      archive_entry_set_gid(entry,zip_entry->gid);
      archive_entry_set_mtime(entry,zip_entry->mtime,0);
      archive_entry_set_ctime(entry,zip_entry->ctime,0);
      archive_entry_set_atime(entry,zip_entry->atime,0);
      if ((zip->entry->mode & 0xf000) != 0xa000) {
        if (0 < zip_entry->uncompressed_size || (zip_entry->zip_flags & 8) == 0) {
          archive_entry_set_size(entry,zip_entry->uncompressed_size);
        }
        goto LAB_0046003d;
      }
      min = *piVar1;
      archive_entry_set_size(entry,0);
      pcVar18 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
      if (pcVar18 == (char *)0x0) {
        pcVar18 = "Truncated Zip file";
      }
      else {
        iVar13 = __archive_read_consume(a,min);
        if (-1 < iVar13) {
          paVar9 = zip->sconv;
          if ((paVar9 == (archive_string_conv *)0x0) &&
             (((zip->entry->zip_flags & 0x800) == 0 ||
              (paVar9 = zip->sconv_utf8, paVar9 == (archive_string_conv *)0x0)))) {
            paVar9 = zip->sconv_default;
          }
          wVar7 = _archive_entry_copy_symlink_l(entry,pcVar18,min,paVar9);
          if (wVar7 != L'\0') {
            piVar10 = __errno_location();
            if ((*piVar10 == 0xc) ||
               (((paVar9 == zip->sconv_utf8 && ((zip->entry->zip_flags & 0x800) != 0)) &&
                (_archive_entry_copy_symlink_l(entry,pcVar18,min,(archive_string_conv *)0x0),
                *piVar10 == 0xc)))) {
              pcVar18 = "Can\'t allocate memory for Symlink";
              goto LAB_0045fc23;
            }
            if ((paVar9 != zip->sconv_utf8) || ((zip->entry->zip_flags & 0x800) == 0)) {
              pcVar18 = archive_string_conversion_charset_name(paVar9);
              archive_set_error(&a->archive,0x54,
                                "Symlink cannot be converted from %s to current locale.",pcVar18);
              wVar6 = L'\xffffffec';
            }
          }
          *piVar1 = 0;
          zip_entry->uncompressed_size = 0;
LAB_0046003d:
          lVar14 = zip_entry->compressed_size;
          zip->entry_bytes_remaining = lVar14;
          if (lVar14 < 1 && (zip_entry->zip_flags & 8) == 0) {
            zip->end_of_entry = '\x01';
          }
          uVar16 = (char)iVar19 * 0x67;
          cVar17 = (char)((uVar16 & 0xffff) >> 0xf) + (char)(uVar16 >> 10);
          lVar14 = 8;
          pcVar18 = "??";
          do {
            if (*(uint *)((long)&PTR_bid_keyword_keys_u_005ffa38 + lVar14) ==
                (uint)zip->entry->compression) {
              pcVar18 = *(char **)((long)&compression_methods[0].id + lVar14);
              break;
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x168);
          snprintf(zip->format_name,0x40,"ZIP %d.%d (%s)",(ulong)(uint)(int)cVar17,
                   (ulong)(uint)(int)(char)((char)iVar19 + cVar17 * -10),pcVar18);
          (a->archive).archive_format_name = zip->format_name;
          return wVar6;
        }
        pcVar18 = "Read error skipping symlink target name";
      }
    }
    else {
      pcVar18 = "Damaged Zip archive";
    }
    iVar19 = -1;
  }
LAB_0045fd80:
  archive_set_error(&a->archive,iVar19,pcVar18);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_local_file_header(struct archive_read *a, struct archive_entry *entry,
    struct zip *zip)
{
	const char *p;
	const void *h;
	const wchar_t *wp;
	const char *cp;
	size_t len, filename_length, extra_length;
	struct archive_string_conv *sconv;
	struct zip_entry *zip_entry = zip->entry;
	struct zip_entry zip_entry_central_dir;
	int ret = ARCHIVE_OK;
	char version;

	/* Save a copy of the original for consistency checks. */
	zip_entry_central_dir = *zip_entry;

	zip->decompress_init = 0;
	zip->end_of_entry = 0;
	zip->entry_uncompressed_bytes_read = 0;
	zip->entry_compressed_bytes_read = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);

	/* Setup default conversion. */
	if (zip->sconv == NULL && !zip->init_default_conversion) {
		zip->sconv_default =
		    archive_string_default_conversion_for_read(&(a->archive));
		zip->init_default_conversion = 1;
	}

	if ((p = __archive_read_ahead(a, 30, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (memcmp(p, "PK\003\004", 4) != 0) {
		archive_set_error(&a->archive, -1, "Damaged Zip archive");
		return ARCHIVE_FATAL;
	}
	version = p[4];
	zip_entry->system = p[5];
	zip_entry->zip_flags = archive_le16dec(p + 6);
	if (zip_entry->zip_flags & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)) {
		zip->has_encrypted_entries = 1;
		archive_entry_set_is_data_encrypted(entry, 1);
		if (zip_entry->zip_flags & ZIP_CENTRAL_DIRECTORY_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_STRONG_ENCRYPTED) {
			archive_entry_set_is_metadata_encrypted(entry, 1);
			return ARCHIVE_FATAL;
		}
	}
	zip_entry->compression = (char)archive_le16dec(p + 8);
	zip_entry->mtime = zip_time(p + 10);
	zip_entry->crc32 = archive_le32dec(p + 14);
	zip_entry->compressed_size = archive_le32dec(p + 18);
	zip_entry->uncompressed_size = archive_le32dec(p + 22);
	filename_length = archive_le16dec(p + 26);
	extra_length = archive_le16dec(p + 28);

	__archive_read_consume(a, 30);

	/* Read the filename. */
	if ((h = __archive_read_ahead(a, filename_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}
	if (zip_entry->zip_flags & ZIP_UTF8_NAME) {
		/* The filename is stored to be UTF-8. */
		if (zip->sconv_utf8 == NULL) {
			zip->sconv_utf8 =
			    archive_string_conversion_from_charset(
				&a->archive, "UTF-8", 1);
			if (zip->sconv_utf8 == NULL)
				return (ARCHIVE_FATAL);
		}
		sconv = zip->sconv_utf8;
	} else if (zip->sconv != NULL)
		sconv = zip->sconv;
	else
		sconv = zip->sconv_default;

	if (archive_entry_copy_pathname_l(entry,
	    h, filename_length, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		ret = ARCHIVE_WARN;
	}
	__archive_read_consume(a, filename_length);

	/* Work around a bug in Info-Zip: When reading from a pipe, it
	 * stats the pipe instead of synthesizing a file entry. */
	if ((zip_entry->mode & AE_IFMT) == AE_IFIFO) {
		zip_entry->mode &= ~ AE_IFMT;
		zip_entry->mode |= AE_IFREG;
	}

	if ((zip_entry->mode & AE_IFMT) == 0) {
		/* Especially in streaming mode, we can end up
		   here without having seen proper mode information.
		   Guess from the filename. */
		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			if (len > 0 && wp[len - 1] == L'/')
				zip_entry->mode |= AE_IFDIR;
			else
				zip_entry->mode |= AE_IFREG;
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			if (len > 0 && cp[len - 1] == '/')
				zip_entry->mode |= AE_IFDIR;
			else
				zip_entry->mode |= AE_IFREG;
		}
		if (zip_entry->mode == AE_IFDIR) {
			zip_entry->mode |= 0775;
		} else if (zip_entry->mode == AE_IFREG) {
			zip_entry->mode |= 0664;
		}
	}

	/* Read the extra data. */
	if ((h = __archive_read_ahead(a, extra_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	process_extra(h, extra_length, zip_entry);
	__archive_read_consume(a, extra_length);

	if (zip_entry->flags & LA_FROM_CENTRAL_DIRECTORY) {
		/* If this came from the central dir, it's size info
		 * is definitive, so ignore the length-at-end flag. */
		zip_entry->zip_flags &= ~ZIP_LENGTH_AT_END;
		/* If local header is missing a value, use the one from
		   the central directory.  If both have it, warn about
		   mismatches. */
		if (zip_entry->crc32 == 0) {
			zip_entry->crc32 = zip_entry_central_dir.crc32;
		} else if (!zip->ignore_crc32
		    && zip_entry->crc32 != zip_entry_central_dir.crc32) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent CRC32 values");
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->compressed_size == 0) {
			zip_entry->compressed_size
			    = zip_entry_central_dir.compressed_size;
		} else if (zip_entry->compressed_size
		    != zip_entry_central_dir.compressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent compressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.compressed_size,
			    (intmax_t)zip_entry->compressed_size);
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->uncompressed_size == 0) {
			zip_entry->uncompressed_size
			    = zip_entry_central_dir.uncompressed_size;
		} else if (zip_entry->uncompressed_size
		    != zip_entry_central_dir.uncompressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent uncompressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.uncompressed_size,
			    (intmax_t)zip_entry->uncompressed_size);
			ret = ARCHIVE_WARN;
		}
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	archive_entry_set_uid(entry, zip_entry->uid);
	archive_entry_set_gid(entry, zip_entry->gid);
	archive_entry_set_mtime(entry, zip_entry->mtime, 0);
	archive_entry_set_ctime(entry, zip_entry->ctime, 0);
	archive_entry_set_atime(entry, zip_entry->atime, 0);

	if ((zip->entry->mode & AE_IFMT) == AE_IFLNK) {
		size_t linkname_length = zip_entry->compressed_size;

		archive_entry_set_size(entry, 0);
		p = __archive_read_ahead(a, linkname_length, NULL);
		if (p == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated Zip file");
			return ARCHIVE_FATAL;
		}
		if (__archive_read_consume(a, linkname_length) < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Read error skipping symlink target name");
			return ARCHIVE_FATAL;
		}

		sconv = zip->sconv;
		if (sconv == NULL && (zip->entry->zip_flags & ZIP_UTF8_NAME))
			sconv = zip->sconv_utf8;
		if (sconv == NULL)
			sconv = zip->sconv_default;
		if (archive_entry_copy_symlink_l(entry, p, linkname_length,
		    sconv) != 0) {
			if (errno != ENOMEM && sconv == zip->sconv_utf8 &&
			    (zip->entry->zip_flags & ZIP_UTF8_NAME))
			    archive_entry_copy_symlink_l(entry, p,
				linkname_length, NULL);
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symlink");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Since there is no character-set regulation for
			 * symlink name, do not report the conversion error
			 * in an automatic conversion.
			 */
			if (sconv != zip->sconv_utf8 ||
			    (zip->entry->zip_flags & ZIP_UTF8_NAME) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Symlink cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
					sconv));
				ret = ARCHIVE_WARN;
			}
		}
		zip_entry->uncompressed_size = zip_entry->compressed_size = 0;
	} else if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip_entry->uncompressed_size > 0) {
		/* Set the size only if it's meaningful. */
		archive_entry_set_size(entry, zip_entry->uncompressed_size);
	}
	zip->entry_bytes_remaining = zip_entry->compressed_size;

	/* If there's no body, force read_data() to return EOF immediately. */
	if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	/* Set up a more descriptive format name. */
	snprintf(zip->format_name, sizeof(zip->format_name), "ZIP %d.%d (%s)",
	    version / 10, version % 10,
	    compression_name(zip->entry->compression));
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}